

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

bool __thiscall CGroupSubSys::parse(CGroupSubSys *this,string *line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  bool bVar7;
  ulong uVar8;
  char *__s;
  StringPiece input;
  vector<StringPiece,_std::allocator<StringPiece>_> pieces;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  vector<StringPiece,_std::allocator<StringPiece>_> local_40;
  
  bVar7 = false;
  lVar4 = std::__cxx11::string::find((char)line,0x3a);
  if (lVar4 != -1) {
    (line->_M_dataplus)._M_p[lVar4] = '\0';
    lVar5 = std::__cxx11::string::find((char)line,0x3a);
    if (lVar5 == -1) {
      bVar7 = false;
    }
    else {
      (line->_M_dataplus)._M_p[lVar5] = '\0';
      iVar3 = atoi((line->_M_dataplus)._M_p);
      this->id = iVar3;
      std::__cxx11::string::substr((ulong)&local_60,(ulong)line);
      std::__cxx11::string::operator=((string *)&this->name,(string *)&local_60);
      paVar1 = &local_60.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
      }
      __s = (line->_M_dataplus)._M_p + lVar4 + 1;
      sVar6 = strlen(__s);
      input.len_ = sVar6;
      input.str_ = __s;
      SplitStringPiece(&local_40,input,',');
      if (local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar4 = 8;
        uVar8 = 0;
        do {
          lVar5 = *(long *)((long)&(local_40.
                                    super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->str_ + lVar4);
          local_60._M_dataplus._M_p = (pointer)paVar1;
          if (lVar5 == 0) {
            local_60._M_string_length = 0;
            local_60.field_2._M_local_buf[0] = '\0';
          }
          else {
            lVar2 = *(long *)((long)local_40.
                                    super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar4 + -8);
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,lVar2,lVar5 + lVar2)
            ;
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->subsystems,&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != paVar1) {
            operator_delete(local_60._M_dataplus._M_p,
                            CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                     local_60.field_2._M_local_buf[0]) + 1);
          }
          uVar8 = uVar8 + 1;
          lVar4 = lVar4 + 0x10;
        } while (uVar8 < (ulong)((long)local_40.
                                       super__Vector_base<StringPiece,_std::allocator<StringPiece>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_40.
                                       super__Vector_base<StringPiece,_std::allocator<StringPiece>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      if (local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_40.super__Vector_base<StringPiece,_std::allocator<StringPiece>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar7 = true;
    }
  }
  return bVar7;
}

Assistant:

bool parse(string& line) {
    size_t first = line.find(':');
    if (first == string::npos)
      return false;
    line[first] = '\0';
    size_t second = line.find(':', first + 1);
    if (second == string::npos)
      return false;
    line[second] = '\0';
    id = atoi(line.c_str());
    name = line.substr(second + 1);
    vector<StringPiece> pieces =
        SplitStringPiece(StringPiece(line.c_str() + first + 1), ',');
    for (size_t i = 0; i < pieces.size(); i++) {
      subsystems.push_back(pieces[i].AsString());
    }
    return true;
  }